

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateLine(HtmlparserCppTest *this,string *expected_line)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int line;
  
  line = (int)((ulong)in_RAX >> 0x20);
  bVar1 = safe_strto32(expected_line,&line);
  if (bVar1) {
    iVar2 = HtmlParser::line_number(&this->parser_);
    if (line == iVar2) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","line","==","parser_.line_number()");
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","safe_strto32(expected_line, &line)");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateLine(const string &expected_line) {
  int line;
  CHECK(safe_strto32(expected_line, &line));
  EXPECT_EQ(line, parser_.line_number())
      << "Unexpected line count at line " << parser_.line_number();
}